

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

void __thiscall QDockWidgetLayout::~QDockWidgetLayout(QDockWidgetLayout *this)

{
  QList<QLayoutItem_*> *in_RDI;
  QLayout *unaff_retaddr;
  
  (in_RDI->d).d = (Data *)&PTR_metaObject_00d13038;
  (in_RDI->d).size = (qsizetype)&PTR__QDockWidgetLayout_00d13140;
  qDeleteAll<QList<QLayoutItem*>>(in_RDI);
  QList<QLayoutItem_*>::~QList((QList<QLayoutItem_*> *)0x58a45d);
  QLayout::~QLayout(unaff_retaddr);
  return;
}

Assistant:

QDockWidgetLayout::~QDockWidgetLayout()
{
    qDeleteAll(item_list);
}